

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  BYTE *s;
  ushort *puVar9;
  ushort *__src;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  uint uVar13;
  BYTE *d;
  byte *pbVar14;
  byte *__dest;
  byte *pbVar15;
  ushort *puVar16;
  ushort *puVar17;
  byte *pbVar18;
  ushort *puVar19;
  BYTE *e;
  byte *pbVar20;
  long lVar21;
  ulong uVar22;
  int local_50;
  
  iVar8 = -1;
  if (source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        iVar8 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxDecompressedSize);
      __dest = (byte *)dest;
      __src = (ushort *)source;
      if (maxDecompressedSize < 0x40) goto LAB_00109e92;
      puVar16 = (ushort *)source;
LAB_001099be:
      while( true ) {
        __src = (ushort *)((long)puVar16 + 1);
        bVar3 = (byte)*puVar16;
        uVar7 = (uint)bVar3;
        uVar22 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00109ec7;
          puVar19 = puVar16 + 1;
          uVar13 = 0;
          puVar16 = puVar16 + 8;
          do {
            puVar17 = puVar16;
            puVar9 = __src;
            __src = (ushort *)((long)puVar9 + 1);
            uVar13 = uVar13 + *(byte *)((long)puVar17 + -0xf);
            puVar19 = (ushort *)((long)puVar19 + 1);
            puVar16 = (ushort *)((long)puVar17 + 1);
          } while (puVar17 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar17 + -0xf) == 0xff);
          uVar22 = (ulong)uVar13 + 0xf;
          pbVar14 = __dest + uVar22;
          if ((CARRY8((ulong)__dest,uVar22)) || ((ulong)-(long)puVar19 < uVar22)) {
            __src = puVar17 + -7;
            goto LAB_00109ec7;
          }
          if (dest + (long)maxDecompressedSize + -0x20 < pbVar14) goto LAB_00109db1;
          puVar16 = (ushort *)((ulong)uVar13 + (long)puVar17 + 1);
          if (puVar1 + -0x10 < puVar16) {
            __src = puVar17 + -7;
            goto LAB_00109db1;
          }
          lVar21 = 0;
          do {
            uVar5 = *(undefined8 *)((byte *)((long)__src + lVar21) + 8);
            pbVar18 = __dest + lVar21;
            *(undefined8 *)pbVar18 = *(undefined8 *)((long)__src + lVar21);
            *(undefined8 *)(pbVar18 + 8) = uVar5;
            pbVar11 = (byte *)((long)puVar9 + lVar21 + 0x11);
            uVar5 = *(undefined8 *)(pbVar11 + 8);
            *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)pbVar11;
            *(undefined8 *)(pbVar18 + 0x18) = uVar5;
            lVar21 = lVar21 + 0x20;
          } while (pbVar18 + 0x20 < pbVar14);
        }
        else {
          pbVar14 = __dest + uVar22;
          if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_00109db1;
          uVar5 = *(undefined8 *)((long)puVar16 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          puVar16 = (ushort *)(uVar22 + (long)__src);
        }
        uVar4 = *puVar16;
        uVar12 = (ulong)uVar4;
        __src = puVar16 + 1;
        pbVar18 = pbVar14 + -uVar12;
        uVar10 = (ulong)(bVar3 & 0xf);
        if (uVar10 == 0xf) break;
        __dest = pbVar14 + uVar10 + 4;
        uVar10 = uVar10 + 4;
        if (pbVar2 + -0x40 <= __dest) goto LAB_00109e33;
        if ((pbVar18 < dest) || (uVar4 < 8)) goto LAB_00109b57;
        *(undefined8 *)pbVar14 = *(undefined8 *)pbVar18;
        *(undefined8 *)(pbVar14 + 8) = *(undefined8 *)(pbVar18 + 8);
        *(undefined2 *)(pbVar14 + 0x10) = *(undefined2 *)(pbVar18 + 0x10);
        puVar16 = __src;
      }
      if (pbVar18 < dest) goto LAB_00109ec7;
      uVar7 = 0;
      puVar16 = __src;
      do {
        __src = (ushort *)((long)puVar16 + 1);
        if (puVar1 + -2 <= __src) goto LAB_00109ec7;
        uVar6 = *puVar16;
        uVar7 = uVar7 + (byte)uVar6;
        puVar16 = __src;
      } while ((byte)uVar6 == 0xff);
      uVar22 = (ulong)uVar7;
      if ((byte *)(-0x10 - uVar22) < pbVar14) goto LAB_00109ec7;
      uVar10 = uVar22 + 0x13;
      if (pbVar14 + uVar22 + 0x13 < pbVar2 + -0x40) {
LAB_00109b57:
        if (pbVar18 < dest) goto LAB_00109ec7;
        __dest = pbVar14 + uVar10;
        puVar16 = __src;
        if (0xf < uVar4) {
          do {
            uVar5 = *(undefined8 *)(pbVar14 + -uVar12 + 8);
            *(undefined8 *)pbVar14 = *(undefined8 *)(pbVar14 + -uVar12);
            *(undefined8 *)(pbVar14 + 8) = uVar5;
            uVar5 = *(undefined8 *)(pbVar14 + -uVar12 + 0x10 + 8);
            *(undefined8 *)(pbVar14 + 0x10) = *(undefined8 *)(pbVar14 + -uVar12 + 0x10);
            *(undefined8 *)(pbVar14 + 0x18) = uVar5;
            pbVar14 = pbVar14 + 0x20;
          } while (pbVar14 < __dest);
          goto LAB_001099be;
        }
        if (uVar12 == 4) {
          iVar8 = *(int *)pbVar18;
        }
        else if (uVar4 == 2) {
          iVar8 = CONCAT22(*(undefined2 *)pbVar18,*(undefined2 *)pbVar18);
        }
        else {
          if (uVar4 != 1) {
            if (uVar4 < 8) {
              pbVar14[0] = 0;
              pbVar14[1] = 0;
              pbVar14[2] = 0;
              pbVar14[3] = 0;
              *pbVar14 = *pbVar18;
              pbVar14[1] = pbVar18[1];
              pbVar14[2] = pbVar18[2];
              pbVar14[3] = pbVar18[3];
              uVar7 = inc32table[uVar4];
              *(undefined4 *)(pbVar14 + 4) = *(undefined4 *)(pbVar18 + uVar7);
              pbVar18 = pbVar18 + ((ulong)uVar7 - (long)dec64table[uVar4]);
            }
            else {
              *(undefined8 *)pbVar14 = *(undefined8 *)pbVar18;
              pbVar18 = pbVar18 + 8;
            }
            pbVar14 = pbVar14 + 8;
            do {
              *(undefined8 *)pbVar14 = *(undefined8 *)pbVar18;
              pbVar14 = pbVar14 + 8;
              pbVar18 = pbVar18 + 8;
            } while (pbVar14 < __dest);
            goto LAB_001099be;
          }
          iVar8 = (uint)*pbVar18 * 0x1010101;
        }
        *(int *)pbVar14 = iVar8;
        *(int *)(pbVar14 + 4) = iVar8;
        if (8 < uVar10) {
          pbVar14 = pbVar14 + 8;
          do {
            *(int *)pbVar14 = iVar8;
            *(int *)(pbVar14 + 4) = iVar8;
            pbVar14 = pbVar14 + 8;
          } while (pbVar14 < __dest);
        }
        goto LAB_001099be;
      }
LAB_00109e33:
      do {
        if (pbVar18 < dest) {
LAB_00109ec7:
          local_50 = (int)source;
          return ~(uint)__src + local_50;
        }
        __dest = pbVar14 + uVar10;
        if ((uint)uVar12 < 8) {
          pbVar14[0] = 0;
          pbVar14[1] = 0;
          pbVar14[2] = 0;
          pbVar14[3] = 0;
          *pbVar14 = *pbVar18;
          pbVar14[1] = pbVar18[1];
          pbVar14[2] = pbVar18[2];
          pbVar14[3] = pbVar18[3];
          uVar22 = (ulong)((uint)uVar12 << 2);
          uVar12 = (ulong)*(uint *)((long)inc32table + uVar22);
          *(undefined4 *)(pbVar14 + 4) = *(undefined4 *)(pbVar18 + uVar12);
          pbVar18 = pbVar18 + (uVar12 - (long)*(int *)((long)dec64table + uVar22));
        }
        else {
          *(undefined8 *)pbVar14 = *(undefined8 *)pbVar18;
          pbVar18 = pbVar18 + 8;
        }
        pbVar11 = pbVar14 + 8;
        if (pbVar2 + -0xc < __dest) {
          if (pbVar2 + -5 < __dest) goto LAB_00109ec7;
          pbVar14 = pbVar2 + -7;
          pbVar15 = pbVar18;
          pbVar20 = pbVar11;
          if (pbVar11 < pbVar14) {
            do {
              *(undefined8 *)pbVar20 = *(undefined8 *)pbVar15;
              pbVar20 = pbVar20 + 8;
              pbVar15 = pbVar15 + 8;
            } while (pbVar20 < pbVar14);
            pbVar18 = pbVar18 + ((long)pbVar14 - (long)pbVar11);
            pbVar11 = pbVar14;
          }
          for (; pbVar11 < __dest; pbVar11 = pbVar11 + 1) {
            bVar3 = *pbVar18;
            pbVar18 = pbVar18 + 1;
            *pbVar11 = bVar3;
          }
        }
        else {
          *(undefined8 *)pbVar11 = *(undefined8 *)pbVar18;
          if (0x10 < uVar10) {
            pbVar14 = pbVar14 + 0x10;
            do {
              pbVar18 = pbVar18 + 8;
              *(undefined8 *)pbVar14 = *(undefined8 *)pbVar18;
              pbVar14 = pbVar14 + 8;
            } while (pbVar14 < __dest);
          }
        }
LAB_00109e92:
        bVar3 = (byte)*__src;
        __src = (ushort *)((long)__src + 1);
        while( true ) {
          uVar7 = (uint)bVar3;
          if (bVar3 >> 4 == 0xf) break;
          uVar22 = (ulong)(uint)(bVar3 >> 4);
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + (long)maxDecompressedSize + -0x20 < __dest)) goto LAB_00109dab;
          uVar5 = *(undefined8 *)(__src + 4);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          pbVar14 = __dest + uVar22;
          uVar10 = (ulong)(uVar7 & 0xf);
          puVar16 = (ushort *)((long)__src + uVar22) + 1;
          uVar4 = *(ushort *)((long)__src + uVar22);
          uVar12 = (ulong)uVar4;
          pbVar18 = pbVar14 + -uVar12;
          if ((((uVar7 & 0xf) == 0xf) || (uVar4 < 8)) || (pbVar18 < dest)) goto LAB_00109df3;
          *(undefined8 *)pbVar14 = *(undefined8 *)pbVar18;
          *(undefined8 *)(pbVar14 + 8) = *(undefined8 *)(pbVar18 + 8);
          *(undefined2 *)(pbVar14 + 0x10) = *(undefined2 *)(pbVar18 + 0x10);
          __dest = pbVar14 + uVar10 + 4;
          bVar3 = *(byte *)((long)__src + uVar22 + 2);
          __src = (ushort *)((long)__src + uVar22 + 3);
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_00109ec7;
        pbVar14 = (byte *)((long)__src + 1);
        uVar13 = 0;
        do {
          uVar4 = *__src;
          __src = (ushort *)((long)__src + 1);
          uVar13 = uVar13 + (byte)uVar4;
          pbVar14 = pbVar14 + 1;
        } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar4 == 0xff);
        uVar22 = (ulong)uVar13 + 0xf;
        if ((CARRY8((ulong)__dest,uVar22)) || ((ulong)-(long)pbVar14 < uVar22)) goto LAB_00109ec7;
LAB_00109dab:
        pbVar14 = __dest + uVar22;
LAB_00109db1:
        puVar16 = (ushort *)((long)__src + uVar22);
        if ((pbVar2 + -0xc < pbVar14) || (puVar1 + -4 < puVar16)) {
          if ((puVar16 == puVar1) && (pbVar14 <= pbVar2)) {
            memmove(__dest,__src,uVar22);
            return ((int)__dest + (int)uVar22) - (int)dest;
          }
          goto LAB_00109ec7;
        }
        do {
          *(undefined8 *)__dest = *(undefined8 *)__src;
          __dest = __dest + 8;
          __src = __src + 4;
        } while (__dest < pbVar14);
        uVar12 = (ulong)*puVar16;
        puVar16 = puVar16 + 1;
        pbVar18 = pbVar14 + -uVar12;
        uVar10 = (ulong)(uVar7 & 0xf);
LAB_00109df3:
        __src = puVar16;
        if ((int)uVar10 == 0xf) {
          uVar7 = 0;
          do {
            puVar19 = puVar16;
            __src = (ushort *)((long)puVar19 + 1);
            if (puVar1 + -2 <= __src) goto LAB_00109ec4;
            uVar7 = uVar7 + (byte)*puVar19;
            puVar16 = __src;
          } while ((byte)*puVar19 == 0xff);
          uVar10 = (ulong)uVar7 + 0xf;
          if (CARRY8((ulong)pbVar14,uVar10)) {
LAB_00109ec4:
            __src = (ushort *)((long)puVar19 + 1);
            goto LAB_00109ec7;
          }
        }
        uVar10 = uVar10 + 4;
      } while( true );
    }
  }
  return iVar8;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}